

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::VerifyEcdsaAdaptorRequest::ConvertFromStruct
          (VerifyEcdsaAdaptorRequest *this,VerifyEcdsaAdaptorRequestStruct *data)

{
  VerifyEcdsaAdaptorRequestStruct *data_local;
  VerifyEcdsaAdaptorRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->adaptor_signature_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->proof_,(string *)&data->proof);
  std::__cxx11::string::operator=((string *)&this->adaptor_,(string *)&data->adaptor);
  std::__cxx11::string::operator=((string *)&this->message_,(string *)&data->message);
  this->is_hashed_ = (bool)(data->is_hashed & 1);
  std::__cxx11::string::operator=((string *)&this->pubkey_,(string *)&data->pubkey);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void VerifyEcdsaAdaptorRequest::ConvertFromStruct(
    const VerifyEcdsaAdaptorRequestStruct& data) {
  adaptor_signature_ = data.adaptor_signature;
  proof_ = data.proof;
  adaptor_ = data.adaptor;
  message_ = data.message;
  is_hashed_ = data.is_hashed;
  pubkey_ = data.pubkey;
  ignore_items = data.ignore_items;
}